

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EmptyMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyMemberSyntax,slang::syntax::EmptyMemberSyntax_const&>
          (BumpAllocator *this,EmptyMemberSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  EmptyMemberSyntax *pEVar8;
  
  pEVar8 = (EmptyMemberSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyMemberSyntax *)this->endPtr < pEVar8 + 1) {
    pEVar8 = (EmptyMemberSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pEVar8 + 1);
  }
  (pEVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pEVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pEVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pEVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  uVar4 = *(undefined4 *)&(args->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar8->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar8->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pEVar8->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar8->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar8->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pEVar8->qualifiers).super_SyntaxListBase.childCount =
       (args->qualifiers).super_SyntaxListBase.childCount;
  sVar2 = (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar8->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pEVar8->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pEVar8->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f7be8;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pEVar8->semi).kind = (args->semi).kind;
  (pEVar8->semi).field_0x2 = uVar5;
  (pEVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar8->semi).rawLen = uVar7;
  (pEVar8->semi).info = pIVar3;
  return pEVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }